

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

void avro::parsing::fixup<std::pair<boost::shared_ptr<avro::Node>,boost::shared_ptr<avro::Node>>>
               (Symbol *s,
               map<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
               *m,set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                  *seen)

{
  int *piVar1;
  placeholder *ppVar2;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar3;
  pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_> *ppVar4;
  const_iterator cVar5;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  *pvVar6;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar7;
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  *ppVar8;
  undefined8 *puVar9;
  ProductionPtr *p;
  pointer p_00;
  key_type local_60;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> local_40;
  
  switch(s->kind_) {
  case sRepeater:
    ptVar3 = boost::
             any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                       (&s->extra_);
    fixup_internal<std::pair<boost::shared_ptr<avro::Node>,boost::shared_ptr<avro::Node>>>
              (&(ptVar3->super_type).tail.tail.head,m,seen);
    p = &(ptVar3->super_type).tail.tail.tail.head;
    goto LAB_00159d8f;
  case sAlternative:
    pvVar6 = boost::
             any_cast<std::vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>>
                       (&s->extra_);
    p_00 = (pvVar6->
           super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if (p_00 != (pvVar6->
                super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fixup_internal<std::pair<boost::shared_ptr<avro::Node>,boost::shared_ptr<avro::Node>>>
                  (p_00,m,seen);
        p_00 = p_00 + 1;
      } while (p_00 != (pvVar6->
                       super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case sPlaceholder:
    ppVar4 = boost::
             any_cast<std::pair<boost::shared_ptr<avro::Node>,boost::shared_ptr<avro::Node>>const&>
                       (&s->extra_);
    local_60.first.px = (ppVar4->first).px;
    local_60.first.pn.pi_ = (ppVar4->first).pn.pi_;
    if (local_60.first.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_60.first.pn.pi_)->use_count_ = (local_60.first.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_60.second.px = (ppVar4->second).px;
    local_60.second.pn.pi_ = (ppVar4->second).pn.pi_;
    if (local_60.second.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_60.second.pn.pi_)->use_count_ = (local_60.second.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    cVar5 = std::
            _Rb_tree<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::_Select1st<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>,_std::less<std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>_>,_std::allocator<std::pair<const_std::pair<boost::shared_ptr<avro::Node>,_boost::shared_ptr<avro::Node>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
            ::find(&m->_M_t,&local_60);
    boost::detail::shared_count::~shared_count(&local_60.second.pn);
    boost::detail::shared_count::~shared_count(&local_60.first.pn);
    if ((_Rb_tree_header *)cVar5._M_node == &(m->_M_t)._M_impl.super__Rb_tree_header) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x18);
      local_60.first.px = (element_type *)&local_60.second;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Placeholder symbol cannot be resolved","");
      std::runtime_error::runtime_error((runtime_error *)(puVar9 + 1),(string *)&local_60);
      *puVar9 = 0x17fa60;
      puVar9[1] = 0x17fa90;
      __cxa_throw(puVar9,&Exception::typeinfo,Exception::~Exception);
    }
    local_40.px = *(element_type **)(cVar5._M_node + 2);
    local_40.pn.pi_ = (sp_counted_base *)cVar5._M_node[2]._M_parent;
    if ((_Base_ptr)local_40.pn.pi_ != (_Base_ptr)0x0) {
      LOCK();
      piVar1 = (int *)((long)&((_Base_ptr)local_40.pn.pi_)->_M_parent + 4);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    Symbol::symbolic((Symbol *)&local_60,&local_40);
    s->kind_ = (Kind)local_60.first.px;
    ppVar2 = (s->extra_).content;
    (s->extra_).content = (placeholder *)local_60.first.pn.pi_;
    local_60.first.pn.pi_ = (sp_counted_base *)0x0;
    if ((ppVar2 != (placeholder *)0x0) &&
       ((*ppVar2->_vptr_placeholder[1])(), local_60.first.pn.pi_ != (sp_counted_base *)0x0)) {
      (*(local_60.first.pn.pi_)->_vptr_sp_counted_base[1])();
    }
    boost::detail::weak_count::~weak_count(&local_40.pn);
    break;
  case sIndirect:
    psVar7 = boost::
             any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                       (&s->extra_);
    local_60.first.px = (element_type *)psVar7->px;
    local_60.first.pn.pi_ = (psVar7->pn).pi_;
    if (local_60.first.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_60.first.pn.pi_)->use_count_ = (local_60.first.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    fixup_internal<std::pair<boost::shared_ptr<avro::Node>,boost::shared_ptr<avro::Node>>>
              ((ProductionPtr *)&local_60,m,seen);
    boost::detail::shared_count::~shared_count(&local_60.first.pn);
    break;
  case sUnionAdjust:
    ppVar8 = boost::
             any_cast<std::pair<unsigned_long,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
                       (&s->extra_);
    p = &ppVar8->second;
LAB_00159d8f:
    fixup_internal<std::pair<boost::shared_ptr<avro::Node>,boost::shared_ptr<avro::Node>>>(p,m,seen)
    ;
    return;
  }
  return;
}

Assistant:

Kind kind() const {
        return kind_;
    }